

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

bool __thiscall
chaiscript::str_less::operator()
          (str_less *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_lhs,
          basic_string_view<char,_std::char_traits<char>_> *t_rhs)

{
  pointer pcVar1;
  bool bVar2;
  
  pcVar1 = (t_lhs->_M_dataplus)._M_p;
  bVar2 = std::
          __lexicographical_compare_impl<char_const*,char_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (pcVar1,pcVar1 + t_lhs->_M_string_length,t_rhs->_M_str,
                     t_rhs->_M_str + t_rhs->_M_len);
  return bVar2;
}

Assistant:

[[nodiscard]] constexpr bool operator()(const LHS &t_lhs, const RHS &t_rhs) const noexcept {
      return std::lexicographical_compare(t_lhs.begin(), t_lhs.end(), t_rhs.begin(), t_rhs.end());
    }